

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

void __thiscall ON_ClippingPlaneSurface::Dump(ON_ClippingPlaneSurface *this,ON_TextLog *text_log)

{
  long lVar1;
  int i;
  long lVar2;
  ON_SimpleArray<ON_UUID_struct> uuid_list;
  ON_SimpleArray<ON_UUID_struct> local_40;
  
  ON_TextLog::Print(text_log,"Clipping plane surface\n");
  ON_TextLog::PushIndent(text_log);
  ON_TextLog::Print(text_log,"Enabled = %d",(ulong)(this->m_clipping_plane).m_bEnabled);
  ON_TextLog::Print(text_log,"View IDs =\n");
  ON_TextLog::PushIndent(text_log);
  local_40._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081c438;
  local_40.m_a = (ON_UUID_struct *)0x0;
  local_40.m_count = 0;
  local_40.m_capacity = 0;
  ON_UuidList::GetUuids(&(this->m_clipping_plane).m_viewport_ids,&local_40);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < local_40.m_count; lVar2 = lVar2 + 1) {
    ON_TextLog::Print(text_log,(ON_UUID *)((local_40.m_a)->Data4 + lVar1 + -8));
    ON_TextLog::Print(text_log,"\n");
    lVar1 = lVar1 + 0x10;
  }
  ON_TextLog::PopIndent(text_log);
  ON_SimpleArray<ON_UUID_struct>::~ON_SimpleArray(&local_40);
  ON_TextLog::Print(text_log,"Plane ID = ");
  ON_TextLog::Print(text_log,&(this->m_clipping_plane).m_plane_id);
  ON_TextLog::Print(text_log,"\n");
  ON_TextLog::Print(text_log,"Plane surface\n");
  ON_TextLog::PushIndent(text_log);
  ON_TextLog::Print(text_log,"ON_PlaneSurface\n");
  ON_TextLog::PopIndent(text_log);
  ON_TextLog::PopIndent(text_log);
  return;
}

Assistant:

void ON_ClippingPlaneSurface::Dump( ON_TextLog& text_log ) const
{
  text_log.Print("Clipping plane surface\n");
  text_log.PushIndent();  
  text_log.Print("Enabled = %d",m_clipping_plane.m_bEnabled);
  text_log.Print("View IDs =\n");
  {
    text_log.PushIndent();
    ON_SimpleArray<ON_UUID> uuid_list;
    m_clipping_plane.m_viewport_ids.GetUuids(uuid_list);
    for( int i=0; i<uuid_list.Count(); i++ )
    {
      text_log.Print( uuid_list[i] );
      text_log.Print("\n");
    }
    text_log.PopIndent();
  }
  text_log.Print("Plane ID = ");
  text_log.Print(m_clipping_plane.m_plane_id);
  text_log.Print("\n");  

  text_log.Print("Plane surface\n");
  text_log.PushIndent();  
  ON_PlaneSurface::Dump(text_log);
  text_log.PopIndent();  
  text_log.PopIndent();  
}